

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

CollationElementIterator * __thiscall
icu_63::RuleBasedCollator::createCollationElementIterator
          (RuleBasedCollator *this,UnicodeString *source)

{
  UBool UVar1;
  RuleBasedCollator *this_00;
  UnicodeString *errorCode_00;
  RuleBasedCollator *local_60;
  CollationElementIterator *cei;
  UnicodeString *pUStack_20;
  UErrorCode errorCode;
  UnicodeString *source_local;
  RuleBasedCollator *this_local;
  
  cei._4_4_ = U_ZERO_ERROR;
  errorCode_00 = (UnicodeString *)((long)&cei + 4);
  pUStack_20 = source;
  source_local = (UnicodeString *)this;
  UVar1 = initMaxExpansions(this,(UErrorCode *)errorCode_00);
  if (UVar1 == '\0') {
    this_local = (RuleBasedCollator *)0x0;
  }
  else {
    this_00 = (RuleBasedCollator *)UMemory::operator_new((UMemory *)0x68,(size_t)errorCode_00);
    local_60 = (RuleBasedCollator *)0x0;
    if (this_00 != (RuleBasedCollator *)0x0) {
      errorCode_00 = pUStack_20;
      CollationElementIterator::CollationElementIterator
                ((CollationElementIterator *)this_00,pUStack_20,this,(UErrorCode *)((long)&cei + 4))
      ;
      local_60 = this_00;
    }
    UVar1 = ::U_FAILURE(cei._4_4_);
    if (UVar1 == '\0') {
      this_local = local_60;
    }
    else {
      if (local_60 != (RuleBasedCollator *)0x0) {
        CollationElementIterator::~CollationElementIterator((CollationElementIterator *)local_60);
        UMemory::operator_delete((UMemory *)local_60,errorCode_00);
      }
      this_local = (RuleBasedCollator *)0x0;
    }
  }
  return (CollationElementIterator *)this_local;
}

Assistant:

CollationElementIterator *
RuleBasedCollator::createCollationElementIterator(const UnicodeString& source) const {
    UErrorCode errorCode = U_ZERO_ERROR;
    if(!initMaxExpansions(errorCode)) { return NULL; }
    CollationElementIterator *cei = new CollationElementIterator(source, this, errorCode);
    if(U_FAILURE(errorCode)) {
        delete cei;
        return NULL;
    }
    return cei;
}